

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::impl::operator>>(basic_istream<char,_std::char_traits<char>_> *in,uint128 *value)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar4 = *(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  std::ws<char,std::char_traits<char>>((istream *)in);
  uVar3 = std::istream::peek();
  iVar2 = (int)in;
  if ((uVar4 & 0x4a) == 8) {
    if ((uVar3 - 0x30 < 10) ||
       ((uVar3 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(uVar3 - 0x41) & 0x3f) & 1) != 0)))) {
      iVar5 = 1;
      uVar8 = 0;
      uVar10 = 0;
      while( true ) {
        while( true ) {
          iVar6 = std::istream::peek();
          if (((9 < iVar6 - 0x30U) &&
              ((0x25 < iVar6 - 0x41U ||
               ((0x3f0000003fU >> ((ulong)(iVar6 - 0x41U) & 0x3f) & 1) == 0)))) &&
             ((iVar5 != 0 || (uVar4 = std::istream::peek(), (uVar4 & 0xffffffdf) != 0x58)))) {
            *(ulong *)&value->value = uVar10;
            *(ulong *)((long)&value->value + 8) = uVar8;
            return in;
          }
          bVar12 = iVar5 != 0;
          iVar5 = iVar5 + -1;
          if ((bVar12) || (uVar4 = std::istream::peek(), (uVar4 & 0xffffffdf) != 0x58)) break;
          std::istream::get();
        }
        if (uVar8 >> 0x3c != 0) break;
        iVar6 = std::istream::get();
        if (iVar6 - 0x30U < 10) {
          uVar7 = (ulong)(iVar6 - 0x30U);
        }
        else if (iVar6 - 0x61U < 6) {
          uVar7 = (ulong)(iVar6 - 0x57);
        }
        else {
          uVar7 = (ulong)(iVar6 + -0x37);
        }
        uVar9 = uVar10 >> 0x3c;
        uVar11 = uVar10 * 0x10;
        uVar10 = uVar11 + uVar7;
        uVar8 = (uVar9 | uVar8 << 4) + (ulong)CARRY8(uVar11,uVar7);
      }
    }
  }
  else {
    if ((uVar4 & 0x4a) != 0x40) {
      if (9 < uVar3 - 0x30) {
        std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)in + -0x18));
        return in;
      }
      uVar10 = 0;
      uVar8 = 0;
      while( true ) {
        iVar5 = std::istream::peek();
        if (iVar5 - 0x3aU < 0xfffffff6) {
          *(ulong *)&value->value = uVar10;
          *(ulong *)((long)&value->value + 8) = uVar8;
          return in;
        }
        if (0x1999999999999998 < uVar8 &&
            (ulong)(uVar10 < 0x999999999999999a) <= uVar8 + 0xe666666666666667) break;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar10;
        uVar10 = SUB168(auVar1 * ZEXT816(10),0);
        uVar8 = SUB168(auVar1 * ZEXT816(10),8) + uVar8 * 10;
        iVar5 = std::istream::get();
        uVar7 = (ulong)(iVar5 + -0x30);
        uVar9 = ~uVar8;
        uVar11 = ~uVar10;
        if (uVar9 < (uVar11 < uVar7)) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)in + -0x18));
        }
        else {
          bVar12 = CARRY8(uVar10,uVar7);
          uVar10 = uVar10 + uVar7;
          uVar8 = uVar8 + bVar12;
        }
        if (uVar9 < (uVar11 < uVar7)) {
          return in;
        }
      }
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)in + -0x18));
      return in;
    }
    if ((uVar3 & 0xfffffff8) == 0x30) {
      uVar4 = std::istream::peek();
      if ((uVar4 & 0xfffffff8) == 0x30) {
        uVar8 = 0;
        uVar10 = 0;
        while( true ) {
          uVar7 = uVar8 * 8;
          iVar5 = std::istream::get();
          uVar9 = uVar8 >> 0x3d;
          uVar8 = (long)(iVar5 + -0x30) + uVar7;
          uVar10 = (uVar10 << 3 | uVar9) + (ulong)CARRY8((long)(iVar5 + -0x30),uVar7);
          uVar4 = std::istream::peek();
          if ((uVar4 & 0xfffffff8) != 0x30) break;
          if (uVar10 >> 0x3d != 0) {
            std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)in + -0x18));
            return in;
          }
        }
      }
      else {
        uVar8 = 0;
        uVar10 = 0;
      }
      *(ulong *)&value->value = uVar8;
      *(ulong *)((long)&value->value + 8) = uVar10;
      return in;
    }
  }
  std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)in + -0x18));
  return in;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }